

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::TrimCapabilitiesPass::HasForbiddenCapabilities(TrimCapabilitiesPass *this)

{
  size_t sVar1;
  IRContext *this_00;
  FeatureManager *this_01;
  CapabilitySet *this_02;
  CapabilitySet *capabilities;
  TrimCapabilitiesPass *this_local;
  
  sVar1 = EnumSet<spv::Capability>::size(&this->forbiddenCapabilities_);
  if (sVar1 == 0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = Pass::context(&this->super_Pass);
    this_01 = IRContext::get_feature_mgr(this_00);
    this_02 = FeatureManager::GetCapabilities(this_01);
    this_local._7_1_ = EnumSet<spv::Capability>::HasAnyOf(this_02,&this->forbiddenCapabilities_);
  }
  return this_local._7_1_;
}

Assistant:

bool TrimCapabilitiesPass::HasForbiddenCapabilities() const {
  // EnumSet.HasAnyOf returns `true` if the given set is empty.
  if (forbiddenCapabilities_.size() == 0) {
    return false;
  }

  const auto& capabilities = context()->get_feature_mgr()->GetCapabilities();
  return capabilities.HasAnyOf(forbiddenCapabilities_);
}